

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_57514da::AddressDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,AddressDescriptor *this
          ,vector<CPubKey,_std::allocator<CPubKey>_> *param_1,Span<const_CScript> param_2,
          FlatSigningProvider *param_3)

{
  long in_FS_OFFSET;
  direct_or_indirect local_38;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&local_38.indirect_contents,&this->m_destination);
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (__return_storage_ptr__,(CScript *)&local_38.indirect_contents);
  if (0x1c < local_1c) {
    free(local_38.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript>, FlatSigningProvider&) const override { return Vector(GetScriptForDestination(m_destination)); }